

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackTest.cpp
# Opt level: O1

void print<std::stack<char,std::vector<char,std::allocator<char>>>>
               (stack<char,_std::vector<char,_std::allocator<char>_>_> *t,char *s)

{
  pointer pcVar1;
  long lVar2;
  undefined8 in_RAX;
  size_t sVar3;
  ostream *poVar4;
  pointer pcVar5;
  undefined8 uStack_38;
  
  lVar2 = std::cout;
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 3;
  uStack_38 = in_RAX;
  if (s == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(lVar2 + -0x18) + 0x1100b0);
  }
  else {
    sVar3 = strlen(s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,s,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," contains:",10);
  if ((t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      (t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    do {
      uStack_38 = CONCAT17(0x20,(undefined7)uStack_38);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)((long)&uStack_38 + 7),1);
      uStack_38._0_7_ =
           CONCAT16((t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1],(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 6),1);
      pcVar1 = (t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar5 = (t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      (t->c).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = pcVar5;
    } while (pcVar1 != pcVar5);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
  std::ostream::put(-0x50);
  std::ostream::flush();
  return;
}

Assistant:

void	print(T & t, char const * s) {
	std::cout << std::setw(3) << s << " contains:";
	while (!t.empty()) {
		std::cout << ' ' << t.top();
		t.pop();
	}
	std::cout << std::endl;
}